

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

void Sdm_ManDivCollect_rec(word t,Vec_Wrd_t **pvDivs)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word local_38;
  int local_24;
  int Counter;
  int Config;
  int i;
  Vec_Wrd_t **pvDivs_local;
  word t_local;
  
  local_24 = 0;
  iVar1 = Sdm_ManCheckDsd6(s_SdmMan,t);
  if ((iVar1 == -1) || (1 < iVar1 >> 0x11)) {
    for (Counter = 0; Counter < 6; Counter = Counter + 1) {
      iVar2 = Abc_Tt6HasVar(t,Counter);
      if (iVar2 != 0) {
        wVar3 = Abc_Tt6Cofactor0(t,Counter);
        Sdm_ManDivCollect_rec(wVar3,pvDivs);
        wVar3 = Abc_Tt6Cofactor1(t,Counter);
        Sdm_ManDivCollect_rec(wVar3,pvDivs);
        local_24 = local_24 + 1;
      }
    }
    if (((iVar1 != -1) && (1 < local_24)) && (local_24 < 5)) {
      local_38 = t;
      if ((t & 1) != 0) {
        local_38 = t ^ 0xffffffffffffffff;
      }
      Vec_WrdPush(pvDivs[local_24],local_38);
    }
  }
  return;
}

Assistant:

void Sdm_ManDivCollect_rec( word t, Vec_Wrd_t ** pvDivs )
{
    int i, Config, Counter = 0;
    // check if function is decomposable
    Config = Sdm_ManCheckDsd6( s_SdmMan, t );
    if ( Config != -1 && (Config >> 17) < 2 )
        return;
    for ( i = 0; i < 6; i++ )
    {
        if ( !Abc_Tt6HasVar( t, i ) )
            continue;
        Sdm_ManDivCollect_rec( Abc_Tt6Cofactor0(t, i), pvDivs );
        Sdm_ManDivCollect_rec( Abc_Tt6Cofactor1(t, i), pvDivs );
        Counter++;
    }
    if ( Config != -1 && Counter >= 2 && Counter <= 4 )
    {
        Vec_WrdPush( pvDivs[Counter], (t & 1) ? ~t : t );
//        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ); printf( "\n" );
    }
}